

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O0

void __thiscall
mp::pre::
RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::PresolveSolutionEntry
          (RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
           *this,LinkEntry *be)

{
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  *this_00;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RSI;
  RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
  *in_RDI;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *orig_cons;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_01;
  LinkEntry *be_00;
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  *in_stack_ffffffffffffff80;
  
  be_00 = (LinkEntry *)0x0;
  this_01 = in_RSI;
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  ::GetDbl(in_stack_ffffffffffffff80,(LinkEntry *)0x0,(size_t)in_RSI);
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  ::SetDbl(in_stack_ffffffffffffff80,be_00,(size_t)this_01,
           (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  this_00 = (BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
             *)GetMC(in_RDI);
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)this_01,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::GetConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
            (this_01,in_stack_ffffffffffffff6c);
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  ::GetNode((BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
             *)this_01,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ValueNode::operator_cast_to_ArrayRef
            ((ValueNode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::ComputeLowerSlack
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_RSI,(ArrayRef<double> *)in_RDI
            );
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  ::SetDbl(this_00,be_00,(size_t)this_01,
           (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x3c8290);
  return;
}

Assistant:

void PresolveSolutionEntry(const typename Base::LinkEntry& be) {
    SetDbl(be, CON_TARGET, GetDbl(be, CON_SRC));
    const auto& orig_cons =
        GetMC().template GetConstraint<RangeCon>(be[CON_SRC]);
    SetDbl(be, VAR_SLK, orig_cons.ComputeLowerSlack(GetNode(VAR_SLK)));
  }